

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O0

void VW_Set_Weight(VW_HANDLE handle,size_t index,size_t offset,float value)

{
  undefined8 in_RDX;
  vw *in_RSI;
  float in_XMM0_Da;
  vw *pointer;
  
  VW::set_weight(in_RSI,(uint32_t)((ulong)in_RDX >> 0x20),(uint32_t)in_RDX,in_XMM0_Da);
  return;
}

Assistant:

VW_DLL_MEMBER void VW_CALLING_CONV VW_Set_Weight(VW_HANDLE handle, size_t index, size_t offset, float value)
{ vw* pointer = static_cast<vw*>(handle);
  return VW::set_weight(*pointer, (uint32_t) index, (uint32_t)offset, value);
}